

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O0

void __thiscall
sampler_tester::sampler_tester
          (sampler_tester *this,vector<float,_std::allocator<float>_> *probs,
          vector<float,_std::allocator<float>_> *probs_expected)

{
  size_type sVar1;
  const_reference pvVar2;
  llama_token_data *plVar3;
  vector<float,_std::allocator<float>_> *in_RSI;
  undefined8 *in_RDI;
  float logit;
  llama_token token_id;
  undefined4 in_stack_ffffffffffffff88;
  int iVar4;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *this_00;
  size_type in_stack_ffffffffffffffa8;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *in_stack_ffffffffffffffb0;
  uint7 uStack_3f;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  
  this_00 = (vector<llama_token_data,_std::allocator<llama_token_data>_> *)(in_RDI + 4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector
            ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x10eb3c);
  std::vector<float,_std::allocator<float>_>::size(in_RSI);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::reserve
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_28 = 0;
  while( true ) {
    iVar4 = local_28;
    sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
    if ((int)sVar1 <= iVar4) break;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_28);
    logf(*pvVar2);
    std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_28);
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::emplace_back<llama_token_data>
              (this_00,(llama_token_data *)CONCAT44(iVar4,in_stack_ffffffffffffff88));
    local_28 = local_28 + 1;
  }
  plVar3 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::data
                     ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x10ec2c);
  sVar1 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::size
                    ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)(in_RDI + 7));
  *in_RDI = plVar3;
  in_RDI[1] = sVar1;
  in_RDI[2] = 0xffffffffffffffff;
  in_RDI[3] = (ulong)uStack_3f << 8;
  return;
}

Assistant:

sampler_tester(const std::vector<float> & probs, const std::vector<float> & probs_expected) : probs_expected(probs_expected) {
        cur.reserve(probs.size());
        for (llama_token token_id = 0; token_id < (llama_token)probs.size(); token_id++) {
            const float logit = logf(probs[token_id]);
            cur.emplace_back(llama_token_data{token_id, logit, probs[token_id]});
        }

        cur_p = llama_token_data_array { cur.data(), cur.size(), -1, false };
    }